

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCex.c
# Opt level: O3

Abc_Cex_t *
Bmc_CexCareSatBasedMinimizeAig(Gia_Man_t *p,Abc_Cex_t *pCex,int fHighEffort,int fVerbose)

{
  undefined4 uVar1;
  byte bVar2;
  Abc_Cex_t *pAVar3;
  sat_solver *psVar4;
  int iVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  int *extraout_RAX;
  int *extraout_RAX_00;
  uint *__ptr;
  void *__dest;
  ulong uVar9;
  undefined8 uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  char *pcVar14;
  long lVar15;
  int iVar16;
  timespec ts;
  int iLit;
  timespec local_a8;
  uint local_94;
  Abc_Cex_t *local_90;
  ulong local_88;
  Vec_Int_t *local_80;
  sat_solver *local_78;
  int local_6c;
  uint local_68;
  lit local_64;
  Abc_Cex_t *local_60;
  uint *local_58;
  uint *local_50;
  Cnf_Dat_t *local_48;
  Gia_Man_t *local_40;
  size_t local_38;
  
  local_6c = fHighEffort;
  clock_gettime(3,&local_a8);
  iVar5 = clock_gettime(3,&local_a8);
  if (iVar5 < 0) {
    lVar11 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),8);
    lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_a8.tv_sec * -1000000;
  }
  local_90 = Bmc_CexCareMinimizeAig(p,p->vCis->nSize - p->nRegs,pCex,1,1,fVerbose);
  uVar13 = local_90->nRegs;
  local_94 = 0;
  if ((int)uVar13 < local_90->nBits) {
    local_94 = 0;
    do {
      local_94 = local_94 +
                 (((uint)(&local_90[1].iPo)[(int)uVar13 >> 5] >> (uVar13 & 0x1f) & 1) != 0);
      uVar13 = uVar13 + 1;
    } while (local_90->nBits != uVar13);
  }
  if (fVerbose != 0) {
    printf("Care bits = %d. ",(ulong)local_94);
    iVar6 = 3;
    iVar5 = clock_gettime(3,&local_a8);
    if (iVar5 < 0) {
      lVar15 = -1;
    }
    else {
      lVar15 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
    }
    Abc_Print(iVar6,"%s =","Non-SAT-based CEX minimization");
    Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar15 + lVar11) / 1000000.0);
  }
  iVar5 = clock_gettime(3,&local_a8);
  if (iVar5 < 0) {
    lVar11 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),8);
    lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_a8.tv_sec * -1000000;
  }
  local_40 = Gia_ManFramesForCexMin(p,pCex->iFrame + 1);
  local_48 = (Cnf_Dat_t *)Mf_ManGenerateCnf(local_40,8,0,0,0,0);
  iVar5 = local_48->nVars;
  iVar16 = ~pCex->iFrame * pCex->nPis;
  local_78 = (sat_solver *)Cnf_DataWriteIntoSolver(local_48,1,0);
  local_64 = 3;
  iVar6 = sat_solver_addclause(local_78,&local_64,(lit *)&local_60);
  if (iVar6 != 0) {
    local_88 = (ulong)(uint)(iVar16 + iVar5);
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    pVVar7->nCap = 100;
    pVVar7->nSize = 0;
    piVar8 = (int *)malloc(400);
    pVVar7->pArray = piVar8;
    uVar13 = pCex->nRegs;
    local_80 = pVVar7;
    if ((int)uVar13 < pCex->nBits) {
      iVar5 = (iVar5 + uVar13 + iVar16) * 2;
      do {
        if ((int)(((int)local_88 + uVar13) - pCex->nRegs) < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        Vec_IntPush(local_80,iVar5 + (uint)(((uint)(&pCex[1].iPo)[(int)uVar13 >> 5] >>
                                             (uVar13 & 0x1f) & 1) != 0) + pCex->nRegs * -2 ^ 1);
        uVar13 = uVar13 + 1;
        iVar5 = iVar5 + 2;
        piVar8 = extraout_RAX;
      } while ((int)uVar13 < pCex->nBits);
    }
    if (fVerbose != 0) {
      iVar6 = 3;
      iVar5 = clock_gettime(3,&local_a8);
      if (iVar5 < 0) {
        lVar15 = -1;
      }
      else {
        lVar15 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
      }
      Abc_Print(iVar6,"%s =","Constructing SAT solver");
      Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar15 + lVar11) / 1000000.0);
      piVar8 = extraout_RAX_00;
    }
    uVar10 = CONCAT71((int7)((ulong)piVar8 >> 8),1);
    bVar2 = 0;
    __ptr = (uint *)0x0;
    local_60 = pCex;
    do {
      local_68 = (uint)uVar10;
      if (__ptr != (uint *)0x0) {
        if (*(void **)(__ptr + 2) != (void *)0x0) {
          free(*(void **)(__ptr + 2));
        }
        free(__ptr);
      }
      __ptr = (uint *)malloc(0x10);
      pVVar7 = local_80;
      uVar13 = local_80->nSize;
      __ptr[1] = uVar13;
      *__ptr = uVar13;
      if ((long)(int)uVar13 == 0) {
        local_50 = __ptr + 2;
        __ptr[2] = 0;
        __ptr[3] = 0;
      }
      else {
        local_38 = (long)(int)uVar13 * 4;
        __dest = malloc(local_38);
        local_50 = __ptr + 2;
        *(void **)(__ptr + 2) = __dest;
        local_58 = __ptr;
        memcpy(__dest,pVVar7->pArray,local_38);
        __ptr = local_58;
        if (!(bool)(~bVar2 & 1 | (int)uVar13 < 2)) {
          uVar12 = uVar13 >> 1;
          uVar9 = 0;
          do {
            uVar13 = uVar13 - 1;
            uVar1 = *(undefined4 *)((long)__dest + uVar9 * 4);
            *(undefined4 *)((long)__dest + uVar9 * 4) =
                 *(undefined4 *)((long)__dest + (long)(int)uVar13 * 4);
            *(undefined4 *)((long)__dest + (long)(int)uVar13 * 4) = uVar1;
            uVar9 = uVar9 + 1;
          } while (uVar12 != uVar9);
        }
      }
      iVar5 = clock_gettime(3,&local_a8);
      psVar4 = local_78;
      if (iVar5 < 0) {
        lVar11 = 1;
      }
      else {
        lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),8);
        lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_a8.tv_sec * -1000000;
      }
      iVar5 = sat_solver_solve(local_78,*(lit **)(__ptr + 2),*(lit **)(__ptr + 2) + (int)__ptr[1],0,
                               0,0,0);
      uVar13 = (psVar4->conf_final).size;
      piVar8 = (psVar4->conf_final).ptr;
      if (fVerbose != 0) {
        pcVar14 = "BUG";
        if (iVar5 == -1) {
          pcVar14 = "OK ";
        }
        printf("Status %s   Selected %5d assumptions out of %5d.  ",pcVar14,(ulong)uVar13);
        iVar16 = 3;
        iVar6 = clock_gettime(3,&local_a8);
        if (iVar6 < 0) {
          lVar15 = -1;
        }
        else {
          lVar15 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
        }
        Abc_Print(iVar16,"%s =","Analyze_final");
        Abc_Print(iVar16,"%9.2f sec\n",(double)(lVar15 + lVar11) / 1000000.0);
      }
      pAVar3 = local_60;
      uVar12 = local_94;
      if ((int)uVar13 < (int)local_94) {
        if (local_90 != (Abc_Cex_t *)0x0) {
          free(local_90);
        }
        local_90 = Bmc_CexCareDeriveCex(pAVar3,(int)local_88,piVar8,uVar13);
        uVar12 = uVar13;
      }
      if (local_6c != 0) {
        iVar6 = clock_gettime(3,&local_a8);
        if (iVar6 < 0) {
          lVar11 = 1;
        }
        else {
          lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),8);
          lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_a8.tv_sec * -1000000;
        }
        uVar13 = sat_solver_minimize_assumptions(local_78,*(int **)(__ptr + 2),__ptr[1],0);
        if (fVerbose != 0) {
          pcVar14 = "BUG";
          if (iVar5 == -1) {
            pcVar14 = "OK ";
          }
          printf("Status %s   Selected %5d assumptions out of %5d.  ",pcVar14,(ulong)uVar13);
          iVar6 = 3;
          iVar5 = clock_gettime(3,&local_a8);
          if (iVar5 < 0) {
            lVar15 = -1;
          }
          else {
            lVar15 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
          }
          Abc_Print(iVar6,"%s =","LEXUNSAT     ");
          Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar15 + lVar11) / 1000000.0);
        }
        if ((int)uVar13 < (int)uVar12) {
          if (local_90 != (Abc_Cex_t *)0x0) {
            free(local_90);
          }
          local_94 = uVar13;
          local_90 = Bmc_CexCareDeriveCex(pAVar3,(int)local_88,*(int **)local_50,uVar13);
          uVar12 = local_94;
        }
      }
      local_94 = uVar12;
      pAVar3 = local_90;
      bVar2 = 1;
      uVar10 = 0;
    } while ((local_68 & 1) != 0);
    if (fVerbose != 0) {
      printf("Final    :    ");
      Bmc_CexPrint(pAVar3,pAVar3->nPis,0);
    }
    if (*(void **)(__ptr + 2) != (void *)0x0) {
      free(*(void **)(__ptr + 2));
      __ptr[2] = 0;
      __ptr[3] = 0;
    }
    free(__ptr);
    pVVar7 = local_80;
    if (local_80->pArray != (int *)0x0) {
      free(local_80->pArray);
    }
    free(pVVar7);
    sat_solver_delete(local_78);
    Cnf_DataFree(local_48);
    Gia_ManStop(local_40);
    return pAVar3;
  }
  __assert_fail("status",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCex.c"
                ,0x224,
                "Abc_Cex_t *Bmc_CexCareSatBasedMinimizeAig(Gia_Man_t *, Abc_Cex_t *, int, int)");
}

Assistant:

Abc_Cex_t * Bmc_CexCareSatBasedMinimizeAig( Gia_Man_t * p, Abc_Cex_t * pCex, int fHighEffort, int fVerbose )
{
    abctime clk = Abc_Clock();
    int n, i, iFirstVar, iLit, status;
    Vec_Int_t * vLits = NULL, * vTemp;
    sat_solver * pSat;
    Cnf_Dat_t * pCnf;
    int nFinal, * pFinal;
    Abc_Cex_t * pCexBest = NULL; 
    int CountBest = 0;
    Gia_Man_t * pFrames;

    // CEX minimization
    clk = Abc_Clock();
    pCexBest = Bmc_CexCareMinimizeAig( p, Gia_ManPiNum(p), pCex, 1, 1, fVerbose );
    for ( i = pCexBest->nRegs; i < pCexBest->nBits; i++ )
        CountBest += Abc_InfoHasBit(pCexBest->pData, i);
    if ( fVerbose )
    {
        printf( "Care bits = %d. ", CountBest );
        Abc_PrintTime( 1, "Non-SAT-based CEX minimization", Abc_Clock() - clk );
    }

    // SAT instance
    clk = Abc_Clock();
    pFrames = Gia_ManFramesForCexMin( p, pCex->iFrame + 1 );
    pCnf = (Cnf_Dat_t*)Mf_ManGenerateCnf( pFrames, 8, 0, 0, 0, 0 );
    iFirstVar = pCnf->nVars - (pCex->iFrame+1) * pCex->nPis;
    pSat = (sat_solver*)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    iLit = Abc_Var2Lit( 1, 1 );
    status = sat_solver_addclause( pSat, &iLit, &iLit + 1 );
    assert( status );
    // create literals
    vTemp = Vec_IntAlloc( 100 );
    for ( i = pCex->nRegs; i < pCex->nBits; i++ )
        Vec_IntPush( vTemp, Abc_Var2Lit(iFirstVar + i - pCex->nRegs, !Abc_InfoHasBit(pCex->pData, i)) );
    if ( fVerbose )
    Abc_PrintTime( 1, "Constructing SAT solver", Abc_Clock() - clk );

    for ( n = 0; n < 2; n++ )
    {
        Vec_IntFreeP( &vLits );

        vLits = Vec_IntDup( vTemp );
        if ( n ) Vec_IntReverseOrder( vLits );

        // SAT-based minimization
        clk = Abc_Clock();
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), 0, 0, 0, 0 );
        nFinal = sat_solver_final( pSat, &pFinal );
        if ( fVerbose )
        {
            printf( "Status %s   Selected %5d assumptions out of %5d.  ", status == l_False ? "OK ":"BUG", nFinal, Vec_IntSize(vLits) );
            Abc_PrintTime( 1, "Analyze_final", Abc_Clock() - clk );
        }
        if ( CountBest > nFinal )
        {
            CountBest = nFinal;
            ABC_FREE( pCexBest );
            pCexBest = Bmc_CexCareDeriveCex( pCex, iFirstVar, pFinal, nFinal );
        }
        if ( !fHighEffort )
            continue;

        // SAT-based minimization
        clk = Abc_Clock();
        nFinal = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vLits), Vec_IntSize(vLits), 0 );
        if ( fVerbose )
        {
            printf( "Status %s   Selected %5d assumptions out of %5d.  ", status == l_False ? "OK ":"BUG", nFinal, Vec_IntSize(vLits) );
            Abc_PrintTime( 1, "LEXUNSAT     ", Abc_Clock() - clk );
        }
        if ( CountBest > nFinal )
        {
            CountBest = nFinal;
            ABC_FREE( pCexBest );
            pCexBest = Bmc_CexCareDeriveCex( pCex, iFirstVar, Vec_IntArray(vLits), nFinal );
        }
    }
    if ( fVerbose )
    {
        printf( "Final    :    " );
        Bmc_CexPrint( pCexBest, pCexBest->nPis, 0 );
    }
    // cleanup
    Vec_IntFreeP( &vLits );
    Vec_IntFreeP( &vTemp );
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    Gia_ManStop( pFrames );
    return pCexBest;
}